

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O0

SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,1,true>,-1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>>
::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,1,true>,_1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
           *this,DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *rhs)

{
  Index IVar1;
  Index IVar2;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  *pCVar3;
  bool bVar4;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *rhs_local;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  IVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::rows((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)this);
  IVar2 = EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::rows((EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)rhs);
  bVar4 = false;
  if (IVar1 == IVar2) {
    IVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::cols((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)this);
    IVar2 = EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::cols((EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)rhs);
    bVar4 = IVar1 == IVar2;
  }
  if (!bVar4) {
    __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ckirksey3[P]extended-kalman-filter-cpp/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                  ,0x88,
                  "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, -1, 1>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, -1, 1>, Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, RhsDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::derived((EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)rhs);
  internal::
  assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0,_0>
  ::run((SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         *)this,pCVar3);
  pCVar3 = EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::derived((EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)rhs);
  DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,1,true>,-1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>>>
  ::
  checkTransposeAliasing<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,1,true>,_1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>>
              *)this,pCVar3);
  return (SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *)this;
}

Assistant:

EIGEN_STRONG_INLINE SelfCwiseBinaryOp& lazyAssign(const DenseBase<RhsDerived>& rhs)
    {
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs,RhsDerived)
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename RhsDerived::Scalar);
      
    #ifdef EIGEN_DEBUG_ASSIGN
      internal::assign_traits<SelfCwiseBinaryOp, RhsDerived>::debug();
    #endif
      eigen_assert(rows() == rhs.rows() && cols() == rhs.cols());
      internal::assign_impl<SelfCwiseBinaryOp, RhsDerived>::run(*this,rhs.derived());
    #ifndef EIGEN_NO_DEBUG
      this->checkTransposeAliasing(rhs.derived());
    #endif
      return *this;
    }